

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus
ZydisReadImmediate(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 id,
                  ZyanU8 size,ZyanBool is_signed,ZyanBool is_relative)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  ZyanUSize ZVar5;
  byte *pbVar6;
  ulong uVar7;
  ZydisDecodedInstructionRawImmValue_ ZVar8;
  
  if (1 < id) {
    __assert_fail("(id == 0) || (id == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x319,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if (is_relative != '\0' && is_signed == '\0') {
    __assert_fail("is_signed || !is_relative",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x31a,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if ((instruction->raw).imm[id].size != '\0') {
    __assert_fail("instruction->raw.imm[id].size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x31b,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  (instruction->raw).imm[id].size = size;
  bVar1 = instruction->length;
  (instruction->raw).imm[id].offset = bVar1;
  (instruction->raw).imm[id].is_signed = is_signed;
  (instruction->raw).imm[id].is_relative = is_relative;
  switch((uint)size << 0x1d | size - 8 >> 3) {
  case 0:
    if (0xe < bVar1) {
      return 0x80200002;
    }
    ZVar5 = state->buffer_len;
    if (ZVar5 == 0) {
      return 0x80200000;
    }
    pbVar6 = state->buffer;
    state->buffer = pbVar6 + 1;
    bVar2 = *pbVar6;
    instruction->length = bVar1 + 1;
    state->buffer_len = ZVar5 - 1;
    if (is_signed != '\0') {
      (instruction->raw).imm[id].value = (ZydisDecodedInstructionRawImmValue_)(long)(char)bVar2;
      return 0x100000;
    }
    ZVar8.u._1_7_ = 0;
    ZVar8.s._0_1_ = bVar2;
    break;
  case 1:
    if (0xd < bVar1) {
      return 0x80200002;
    }
    uVar7 = state->buffer_len;
    if (uVar7 < 2) {
      return 0x80200000;
    }
    instruction->length = bVar1 + 2;
    uVar3 = *(ushort *)state->buffer;
    ZVar8 = (ZydisDecodedInstructionRawImmValue_)(long)(short)uVar3;
    state->buffer = (ZyanU8 *)((long)state->buffer + 2);
    state->buffer_len = uVar7 - 2;
    if (is_signed == '\0') {
      ZVar8.u._2_6_ = 0;
      ZVar8.s._0_2_ = uVar3;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x358,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  case 3:
    if (0xb < bVar1) {
      return 0x80200002;
    }
    uVar7 = state->buffer_len;
    if (uVar7 < 4) {
      return 0x80200000;
    }
    instruction->length = bVar1 + 4;
    uVar4 = *(uint *)state->buffer;
    ZVar8 = (ZydisDecodedInstructionRawImmValue_)(long)(int)uVar4;
    state->buffer = (ZyanU8 *)((long)state->buffer + 4);
    state->buffer_len = uVar7 - 4;
    if (is_signed == '\0') {
      ZVar8.u._4_4_ = 0;
      ZVar8.s._0_4_ = uVar4;
    }
    break;
  case 7:
    if (7 < bVar1) {
      return 0x80200002;
    }
    uVar7 = state->buffer_len;
    if (7 < uVar7) {
      instruction->length = bVar1 + 8;
      ZVar8 = *(ZydisDecodedInstructionRawImmValue_ *)state->buffer;
      state->buffer = (ZyanU8 *)((ZydisDecodedInstructionRawImmValue_ *)state->buffer + 1);
      state->buffer_len = uVar7 - 8;
      (instruction->raw).imm[id].value = ZVar8;
      return 0x100000;
    }
    return 0x80200000;
  }
  (instruction->raw).imm[id].value = ZVar8;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisReadImmediate(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8 id, ZyanU8 size, ZyanBool is_signed,
    ZyanBool is_relative)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT((id == 0) || (id == 1));
    ZYAN_ASSERT(is_signed || !is_relative);
    ZYAN_ASSERT(instruction->raw.imm[id].size == 0);

    instruction->raw.imm[id].size = size;
    instruction->raw.imm[id].offset = instruction->length;
    instruction->raw.imm[id].is_signed = is_signed;
    instruction->raw.imm[id].is_relative = is_relative;
    switch (size)
    {
    case 8:
    {
        ZyanU8 value;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &value));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI8)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 16:
    {
        ZyanU16 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 2));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI16)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 32:
    {
        ZyanU32 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 4));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI32)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 64:
    {
        ZyanU64 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 8));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI64)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    // TODO: Fix endianess on big-endian systems

    return ZYAN_STATUS_SUCCESS;
}